

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.h
# Opt level: O2

cmCommand * __thiscall cmOutputRequiredFilesCommand::Clone(cmOutputRequiredFilesCommand *this)

{
  cmOutputRequiredFilesCommand *this_00;
  
  this_00 = (cmOutputRequiredFilesCommand *)operator_new(0x70);
  cmOutputRequiredFilesCommand(this_00);
  return &this_00->super_cmCommand;
}

Assistant:

cmCommand* Clone() override { return new cmOutputRequiredFilesCommand; }